

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

QList<QListWidgetItem_*> * __thiscall
QListWidget::findItems
          (QList<QListWidgetItem_*> *__return_storage_ptr__,QListWidget *this,QString *text,
          MatchFlags flags)

{
  long *plVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_90 [24];
  QArrayData *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  plVar1 = (long *)QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_90,pQVar2,0,0);
  ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
  (**(code **)(*plVar1 + 0x150))
            (&local_78,plVar1,local_90,0,&local_58,0xffffffff,
             flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i)
  ;
  ::QVariant::~QVariant((QVariant *)&local_58);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QListWidgetItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar4 = (uint)local_68;
  QList<QListWidgetItem_*>::reserve(__return_storage_ptr__,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    lVar6 = 0;
    do {
      lVar3 = QMetaObject::cast((QObject *)&QListModel::staticMetaObject);
      if ((ulong)(long)*(int *)(puStack_70 + lVar6) < *(ulong *)(lVar3 + 0x20)) {
        local_58.shared =
             (PrivateShared *)
             *(undefined8 *)(*(long *)(lVar3 + 0x18) + (long)*(int *)(puStack_70 + lVar6) * 8);
      }
      else {
        local_58.shared = (PrivateShared *)0x0;
      }
      QtPrivate::QPodArrayOps<QListWidgetItem*>::emplace<QListWidgetItem*&>
                ((QPodArrayOps<QListWidgetItem*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QListWidgetItem **)&local_58.shared);
      QList<QListWidgetItem_*>::end(__return_storage_ptr__);
      lVar6 = lVar6 + 0x18;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QListWidgetItem*> QListWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QListWidget);
    QModelIndexList indexes = d->listModel()->match(model()->index(0, 0, QModelIndex()),
                                                Qt::DisplayRole, text, -1, flags);
    QList<QListWidgetItem*> items;
    const int indexesSize = indexes.size();
    items.reserve(indexesSize);
    for (int i = 0; i < indexesSize; ++i)
        items.append(d->listModel()->at(indexes.at(i).row()));
    return items;
}